

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O0

ostream * __thiscall
Potassco::AspifTextOutput::printName(AspifTextOutput *this,ostream *os,Lit_t lit)

{
  bool bVar1;
  string *this_00;
  ostream *this_01;
  uint *puVar2;
  Atom_t in_EDX;
  Data *in_RSI;
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
  *in_RDI;
  string *name;
  Atom_t id;
  Atom_t in_stack_0000006c;
  Data *in_stack_00000070;
  value_type *in_stack_ffffffffffffffc8;
  Atom_t local_18;
  
  if ((int)in_EDX < 0) {
    std::operator<<((ostream *)in_RSI,"not ");
  }
  local_18 = atom(in_EDX);
  this_00 = Data::getAtomName_abi_cxx11_(in_RSI,in_EDX);
  if (this_00 == (string *)0x0) {
    this_01 = std::operator<<((ostream *)in_RSI,"x_");
    std::ostream::operator<<(this_01,local_18);
    if (((ulong)in_RDI[1].
                super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish & 0x100000000) == 0) {
      *(undefined1 *)
       ((long)&in_RDI[1].
               super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
               ._M_impl.super__Vector_impl_data._M_finish + 4) = 1;
      bVar1 = std::
              vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
              ::empty((vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
                       *)this_00);
      if (bVar1) {
        std::
        vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
        ::push_back(in_RDI,in_stack_ffffffffffffffc8);
      }
      Data::setGenName(in_stack_00000070,in_stack_0000006c);
    }
  }
  else {
    std::operator<<((ostream *)in_RSI,(string *)this_00);
  }
  puVar2 = std::max<unsigned_int>
                     ((uint *)((long)&in_RDI[1].
                                      super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                      &local_18);
  *(uint *)((long)&in_RDI[1].
                   super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = *puVar2;
  return (ostream *)in_RSI;
}

Assistant:

std::ostream& AspifTextOutput::printName(std::ostream& os, Lit_t lit) {
	if (lit < 0) { os << "not "; }
	Atom_t id = Potassco::atom(lit);
	if (const std::string* name = data_->getAtomName(id)) {
		os << *name;
	}
	else {
		os << "x_" << id;
		if (!showAtoms_) {
			showAtoms_ = true;
			if (data_->atoms.empty()) { data_->atoms.push_back(0); }
			data_->setGenName(0);
		}
	}
	maxAtom_ = std::max(maxAtom_, id);
	return os;
}